

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evolution-test.c++
# Opt level: O1

ChangeInfo *
capnp::compiler::anon_unknown_0::structAddField
          (ChangeInfo *__return_storage_ptr__,Builder decl,uint *nextOrdinal,bool scopeHasUnion)

{
  long lVar1;
  ArrayPtr<const_char> AVar2;
  StructReader other;
  StructReader other_00;
  CapTableBuilder *pCVar3;
  ChangeInfo *pCVar4;
  uint uVar5;
  uint index;
  WirePointer WVar6;
  ulong uVar7;
  long *plVar8;
  char *pcVar9;
  uint *params_1;
  ArrayPtr<const_char> *pAVar10;
  SegmentBuilder *pSVar11;
  ulong uVar12;
  ElementCount index_00;
  undefined8 *puVar13;
  Reader value;
  Reader value_00;
  uint ordinal;
  BuilderFor<capnp::List<capnp::compiler::Declaration,_(capnp::Kind)3>_> oldNested;
  Builder fieldDecl;
  Orphan<capnp::List<capnp::compiler::Declaration,_(capnp::Kind)3>_> oldNestedOrphan;
  Builder newNested;
  StructBuilder local_1c0;
  undefined8 uStack_198;
  uint local_18c;
  ListBuilder local_188;
  StructBuilder local_160;
  WirePointer *local_138;
  SegmentBuilder *local_130;
  SegmentBuilder *local_128;
  ChangeInfo *local_120;
  StructBuilder local_118;
  OrphanBuilder local_f0;
  ListBuilder local_d0;
  StructBuilder local_a8;
  ListBuilder local_80;
  StructBuilder local_58;
  
  local_118.segment = decl._builder.segment;
  local_118.capTable = decl._builder.capTable;
  local_118.data = decl._builder.pointers + 2;
  _::PointerBuilder::disown((OrphanBuilder *)&local_1c0,(PointerBuilder *)&local_118);
  local_f0.capTable = (CapTableBuilder *)local_1c0.data;
  local_f0.location = (word *)local_1c0.pointers;
  local_f0.tag.content = (uint64_t)local_1c0.segment;
  local_f0.segment = (SegmentBuilder *)local_1c0.capTable;
  _::OrphanBuilder::asStructList(&local_188,&local_f0,(StructSize)0x80002);
  local_1c0.segment = decl._builder.segment;
  local_1c0.capTable = decl._builder.capTable;
  local_1c0.data = decl._builder.pointers + 2;
  local_120 = __return_storage_ptr__;
  _::PointerBuilder::initStructList
            (&local_d0,(PointerBuilder *)&local_1c0,local_188.elementCount + 1,(StructSize)0x80002);
  uVar5 = rand();
  index_00 = 0;
  uVar7 = (ulong)uVar5 % (ulong)(local_188.elementCount + 1);
  uVar5 = (uint)uVar7;
  if (uVar5 != 0) {
    do {
      _::ListBuilder::getStructElement((StructBuilder *)&local_80,&local_188,index_00);
      _::StructBuilder::asReader((StructBuilder *)&local_80);
      _::ListBuilder::getStructElement(&local_118,&local_d0,index_00);
      other.capTable._0_4_ = (int)local_1c0.capTable;
      other.segment = &(local_1c0.segment)->super_SegmentReader;
      other.capTable._4_4_ = (int)((ulong)local_1c0.capTable >> 0x20);
      other.data._0_4_ = (int)local_1c0.data;
      other.data._4_4_ = (int)((ulong)local_1c0.data >> 0x20);
      other.pointers._0_4_ = (int)local_1c0.pointers;
      other.pointers._4_4_ = (int)((ulong)local_1c0.pointers >> 0x20);
      other.dataSize = local_1c0.dataSize;
      other.pointerCount = local_1c0.pointerCount;
      other._38_2_ = local_1c0._38_2_;
      other._40_8_ = uStack_198;
      _::StructBuilder::copyContentFrom(&local_118,other);
      index_00 = index_00 + 1;
    } while (index_00 < uVar5);
  }
  index = uVar5 + 1;
  if (index < local_d0.elementCount) {
    do {
      uVar12 = (ulong)index;
      _::ListBuilder::getStructElement((StructBuilder *)&local_80,&local_188,(ElementCount)uVar7);
      _::StructBuilder::asReader((StructBuilder *)&local_80);
      _::ListBuilder::getStructElement(&local_118,&local_d0,index);
      other_00.capTable._0_4_ = (int)local_1c0.capTable;
      other_00.segment = &(local_1c0.segment)->super_SegmentReader;
      other_00.capTable._4_4_ = (int)((ulong)local_1c0.capTable >> 0x20);
      other_00.data._0_4_ = (int)local_1c0.data;
      other_00.data._4_4_ = (int)((ulong)local_1c0.data >> 0x20);
      other_00.pointers._0_4_ = (int)local_1c0.pointers;
      other_00.pointers._4_4_ = (int)((ulong)local_1c0.pointers >> 0x20);
      other_00.dataSize = local_1c0.dataSize;
      other_00.pointerCount = local_1c0.pointerCount;
      other_00._38_2_ = local_1c0._38_2_;
      other_00._40_8_ = uStack_198;
      _::StructBuilder::copyContentFrom(&local_118,other_00);
      index = index + 1;
      uVar7 = uVar12;
    } while (index < local_d0.elementCount);
  }
  _::ListBuilder::getStructElement(&local_160,&local_d0,uVar5);
  if (local_f0.segment != (SegmentBuilder *)0x0) {
    _::OrphanBuilder::euthanize(&local_f0);
  }
  local_18c = *nextOrdinal;
  params_1 = (uint *)(ulong)(local_18c + 1);
  *nextOrdinal = local_18c + 1;
  local_118.segment = local_160.segment;
  local_118.capTable = local_160.capTable;
  local_118.data = local_160.pointers;
  _::PointerBuilder::initStruct(&local_1c0,(PointerBuilder *)&local_118,(StructSize)0x10001);
  kj::str<char_const(&)[2],unsigned_int&>
            ((String *)&local_188,(kj *)0x1e2dd0,(char (*) [2])&local_18c,params_1);
  pSVar11 = local_188.segment;
  if ((SegmentBuilder *)local_188.capTable == (SegmentBuilder *)0x0) {
    pSVar11 = (SegmentBuilder *)0x1e3c21;
  }
  value.super_StringPtr.content.size_ =
       (long)&((SegmentReader *)&(local_188.capTable)->super_CapTableReader)->arena +
       (ulong)((SegmentBuilder *)local_188.capTable == (SegmentBuilder *)0x0);
  local_118.segment = local_1c0.segment;
  local_118.capTable = local_1c0.capTable;
  local_118.data = local_1c0.pointers;
  value.super_StringPtr.content.ptr = (char *)pSVar11;
  _::PointerBuilder::setBlob<capnp::Text>((PointerBuilder *)&local_118,value);
  pCVar3 = local_188.capTable;
  pSVar11 = local_188.segment;
  if (local_188.segment != (SegmentBuilder *)0x0) {
    local_188.segment = (SegmentBuilder *)0x0;
    local_188.capTable = (CapTableBuilder *)0x0;
    (**(code **)*(WirePointer *)local_188.ptr)(local_188.ptr,pSVar11,1,pCVar3,pCVar3,0);
  }
  *(undefined2 *)local_160.data = 2;
  local_118.data = local_160.pointers + 1;
  local_118.segment = local_160.segment;
  local_118.capTable = local_160.capTable;
  _::PointerBuilder::initStruct(&local_1c0,(PointerBuilder *)&local_118,(StructSize)0x2);
  WVar6.field_1.upper32Bits = 0;
  WVar6.offsetAndKind.value = local_18c;
  *(WirePointer *)local_1c0.data = WVar6;
  *(undefined2 *)((long)local_160.data + 2) = 6;
  *(undefined2 *)((long)local_160.data + 0xc) = 0;
  local_1c0.data = local_160.pointers + 5;
  local_1c0.segment = local_160.segment;
  local_1c0.capTable = local_160.capTable;
  _::PointerBuilder::clear((PointerBuilder *)&local_1c0);
  local_1c0.data = local_160.pointers + 6;
  local_1c0.segment = local_160.segment;
  local_1c0.capTable = local_160.capTable;
  _::PointerBuilder::clear((PointerBuilder *)&local_1c0);
  local_138 = local_160.pointers;
  local_1c0.data = local_160.pointers + 5;
  local_128 = local_160.segment;
  local_1c0.segment = local_160.segment;
  local_130 = (SegmentBuilder *)local_160.capTable;
  local_1c0.capTable = local_160.capTable;
  _::PointerBuilder::initStruct(&local_58,(PointerBuilder *)&local_1c0,(StructSize)0x20003);
  uVar5 = rand();
  uVar7 = (ulong)((uVar5 & 7) << 5);
  pAVar10 = (ArrayPtr<const_char> *)((long)&(anonymous_namespace)::TYPE_OPTIONS + uVar7);
  uVar5 = rand();
  if ((uVar5 & 3) == 0) {
    *(undefined2 *)local_58.data = 9;
    local_1c0.segment = local_58.segment;
    local_1c0.capTable = local_58.capTable;
    local_1c0.data = local_58.pointers;
    _::PointerBuilder::clear((PointerBuilder *)&local_1c0);
    local_1c0.segment = local_58.segment;
    local_1c0.capTable = local_58.capTable;
    local_1c0.data = local_58.pointers + 1;
    _::PointerBuilder::clear((PointerBuilder *)&local_1c0);
    local_1c0.segment = local_58.segment;
    local_1c0.capTable = local_58.capTable;
    local_1c0.data = local_58.pointers;
    _::PointerBuilder::initStruct(&local_118,(PointerBuilder *)&local_1c0,(StructSize)0x20003);
    *(undefined2 *)&((WireValue<uint32_t> *)local_118.data)->value = 5;
    local_188.segment = local_118.segment;
    local_188.capTable = local_118.capTable;
    local_188.ptr = (byte *)local_118.pointers;
    _::PointerBuilder::initStruct(&local_1c0,(PointerBuilder *)&local_188,(StructSize)0x10001);
    local_188.segment = local_1c0.segment;
    local_188.capTable = local_1c0.capTable;
    local_188.ptr = (byte *)local_1c0.pointers;
    value_00.super_StringPtr.content.size_ = 5;
    value_00.super_StringPtr.content.ptr = "List";
    _::PointerBuilder::setBlob<capnp::Text>((PointerBuilder *)&local_188,value_00);
    local_1c0.segment = local_58.segment;
    local_1c0.capTable = local_58.capTable;
    local_1c0.data = local_58.pointers + 1;
    _::PointerBuilder::initStructList(&local_80,(PointerBuilder *)&local_1c0,1,(StructSize)0x20001);
    _::ListBuilder::getStructElement((StructBuilder *)&local_d0,&local_80,0);
    local_1c0.data = (void *)(CONCAT44(local_d0.step,local_d0.elementCount) + 8);
    local_1c0.segment = local_d0.segment;
    local_1c0.capTable = local_d0.capTable;
    _::PointerBuilder::initStruct
              ((StructBuilder *)&local_188,(PointerBuilder *)&local_1c0,(StructSize)0x20003);
    AVar2 = *pAVar10;
    *(undefined2 *)&((WireValue<uint32_t> *)local_188.ptr)->value = 5;
    local_f0.tag.content = (uint64_t)local_188.segment;
    local_f0.segment = (SegmentBuilder *)local_188.capTable;
    _::PointerBuilder::initStruct(&local_1c0,(PointerBuilder *)&local_f0,(StructSize)0x10001);
    local_f0.tag.content = (uint64_t)local_1c0.segment;
    local_f0.segment = (SegmentBuilder *)local_1c0.capTable;
    local_f0.capTable = (CapTableBuilder *)local_1c0.pointers;
    _::PointerBuilder::setBlob<capnp::Text>((PointerBuilder *)&local_f0,(Reader)AVar2);
    plVar8 = (long *)operator_new(0x10);
    *plVar8 = (long)&PTR_operator___0020c940;
    plVar8[1] = (long)pAVar10;
    puVar13 = &kj::_::
               HeapDisposer<kj::ConstFunction<void(capnp::compiler::Expression::Builder)>::Impl<capnp::compiler::(anonymous_namespace)::randomizeType(capnp::compiler::Expression::Builder)::$_0>>
               ::instance;
  }
  else {
    AVar2 = *pAVar10;
    *(undefined2 *)local_58.data = 5;
    local_118.segment = local_58.segment;
    local_118.capTable = local_58.capTable;
    local_118.data = local_58.pointers;
    _::PointerBuilder::initStruct(&local_1c0,(PointerBuilder *)&local_118,(StructSize)0x10001);
    local_118.segment = local_1c0.segment;
    local_118.capTable = local_1c0.capTable;
    local_118.data = local_1c0.pointers;
    _::PointerBuilder::setBlob<capnp::Text>((PointerBuilder *)&local_118,(Reader)AVar2);
    lVar1 = *(long *)(&DAT_00211318 + uVar7);
    plVar8 = (long *)operator_new(0x10);
    *plVar8 = (long)&PTR_operator___0020d010;
    plVar8[1] = lVar1;
    puVar13 = &kj::_::
               HeapDisposer<kj::ConstFunction<void(capnp::compiler::Expression::Builder)>::Impl<kj::ConstFunction<void(capnp::compiler::Expression::Builder)>::Iface_const&>>
               ::instance;
  }
  uVar5 = rand();
  pCVar4 = local_120;
  if ((uVar5 & 3) == 0) {
    *(undefined2 *)((long)local_160.data + 0xc) = 1;
    local_1c0.data = local_138 + 6;
    local_1c0.segment = local_128;
    local_1c0.capTable = (CapTableBuilder *)local_130;
    _::PointerBuilder::initStruct(&local_a8,(PointerBuilder *)&local_1c0,(StructSize)0x20003);
    (**(code **)*plVar8)(plVar8);
  }
  else {
    *(undefined2 *)((long)local_160.data + 0xc) = 0;
  }
  pCVar4->kind = COMPATIBLE;
  kj::heapString(&pCVar4->description,10);
  pcVar9 = (char *)(pCVar4->description).content.size_;
  if (pcVar9 != (char *)0x0) {
    pcVar9 = (pCVar4->description).content.ptr;
  }
  builtin_strncpy(pcVar9,"Add field.",10);
  (**(code **)*puVar13)(puVar13,(long)plVar8 + *(long *)(*plVar8 + -0x10));
  return pCVar4;
}

Assistant:

static ChangeInfo structAddField(Declaration::Builder decl, uint& nextOrdinal, bool scopeHasUnion) {
  auto fieldDecl = addNested(decl);

  uint ordinal = nextOrdinal++;

  fieldDecl.initName().setValue(kj::str("f", ordinal));
  fieldDecl.getId().initOrdinal().setValue(ordinal);

  auto field = fieldDecl.initField();

  auto makeValue = randomizeType(field.initType());
  if (rand() % 4 == 0) {
    makeValue(field.getDefaultValue().initValue());
  } else {
    field.getDefaultValue().setNone();
  }
  return { COMPATIBLE, "Add field." };
}